

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall Extent_ComparisonOperators_Test::TestBody(Extent_ComparisonOperators_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_ad0;
  AssertHelper local_ab0;
  Message local_aa8;
  bool local_a99;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_a68;
  Message local_a60;
  bool local_a51;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_a20;
  Message local_a18;
  bool local_a09;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_9d8;
  Message local_9d0;
  bool local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_990;
  Message local_988;
  bool local_979;
  undefined1 local_978 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_948;
  Message local_940;
  bool local_931;
  undefined1 local_930 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_900;
  Message local_8f8;
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_828;
  Message local_820;
  bool local_811;
  undefined1 local_810 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_7e0;
  Message local_7d8;
  bool local_7c9;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_798;
  Message local_790;
  bool local_781;
  undefined1 local_780 [8];
  AssertionResult gtest_ar__24;
  undefined1 local_768 [8];
  extent<unsigned_char> extent2_2;
  undefined1 local_750 [8];
  extent<unsigned_char> extent1_2;
  AssertHelper local_720;
  Message local_718;
  bool local_709;
  undefined1 local_708 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_6d8;
  Message local_6d0;
  bool local_6c1;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_690;
  Message local_688;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_648;
  Message local_640;
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_600;
  Message local_5f8;
  bool local_5e9;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_5b8;
  Message local_5b0;
  bool local_5a1;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_570;
  Message local_568;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_528;
  Message local_520;
  bool local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_4e0;
  Message local_4d8;
  bool local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_498;
  Message local_490;
  bool local_481;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_450;
  Message local_448;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_3d8 [8];
  extent<unsigned_char> extent2_1;
  undefined1 local_3c0 [8];
  extent<unsigned_char> extent1_1;
  AssertHelper local_390;
  Message local_388;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_300;
  Message local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2b8;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_270;
  Message local_268;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70 [3];
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  undefined1 local_38 [8];
  extent<unsigned_char> extent2;
  undefined1 local_20 [8];
  extent<unsigned_char> extent1;
  Extent_ComparisonOperators_Test *this_local;
  
  extent1.size = (uint64_t)this;
  extent2.size = (uint64_t)pstore::typed_address<unsigned_char>::make(2);
  _local_20 = pstore::make_extent<unsigned_char>((typed_address<unsigned_char>)extent2.size,4);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::typed_address<unsigned_char>::make(2);
  _local_38 = pstore::make_extent<unsigned_char>
                        ((typed_address<unsigned_char>)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,4);
  local_51 = pstore::operator==((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_38)
  ;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)"extent1 == extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_a9 = pstore::operator!=((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_38)
  ;
  local_a9 = !local_a9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_a8,
               (AssertionResult *)"!(extent1 != extent2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_f1 = pstore::operator<((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_38);
  local_f1 = !local_f1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_f0,
               (AssertionResult *)"!(extent1 < extent2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_139 = pstore::operator<=((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_38
                                );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_138,
               (AssertionResult *)"extent1 <= extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_181 = pstore::operator>((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_38)
  ;
  local_181 = !local_181;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_180,
               (AssertionResult *)"!(extent1 > extent2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1c9 = pstore::operator>=((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_38
                                );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1c8,
               (AssertionResult *)"extent1 >= extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_211 = pstore::operator==((extent<unsigned_char> *)local_20,(extent<unsigned_char> *)local_20
                                );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_210,
               (AssertionResult *)"extent1 == extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_259 = pstore::operator!=((extent<unsigned_char> *)local_38,(extent<unsigned_char> *)local_20
                                );
  local_259 = !local_259;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_258,
               (AssertionResult *)"!(extent2 != extent1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_2a1 = pstore::operator<((extent<unsigned_char> *)local_38,(extent<unsigned_char> *)local_20)
  ;
  local_2a1 = !local_2a1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_2a0,
               (AssertionResult *)"!(extent2 < extent1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2e9 = pstore::operator<=((extent<unsigned_char> *)local_38,(extent<unsigned_char> *)local_20
                                );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_2e8,
               (AssertionResult *)"extent2 <= extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_331 = pstore::operator>((extent<unsigned_char> *)local_38,(extent<unsigned_char> *)local_20)
  ;
  local_331 = !local_331;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_330,
               (AssertionResult *)"!(extent2 > extent1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xfb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_379 = pstore::operator>=((extent<unsigned_char> *)local_38,(extent<unsigned_char> *)local_20
                                );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&extent1_1.size,(internal *)local_378,
               (AssertionResult *)"extent2 >= extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&extent1_1.size);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  extent2_1.size = (uint64_t)pstore::typed_address<unsigned_char>::make(2);
  _local_3c0 = pstore::make_extent<unsigned_char>((typed_address<unsigned_char>)extent2_1.size,4);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::typed_address<unsigned_char>::make(5);
  _local_3d8 = pstore::make_extent<unsigned_char>
                         ((typed_address<unsigned_char>)
                          gtest_ar__12.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,4);
  local_3f1 = pstore::operator!=((extent<unsigned_char> *)local_3c0,
                                 (extent<unsigned_char> *)local_3d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_3f0,
               (AssertionResult *)"extent1 != extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_439 = pstore::operator!=((extent<unsigned_char> *)local_3d8,
                                 (extent<unsigned_char> *)local_3c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_438,
               (AssertionResult *)"extent2 != extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x105,pcVar2);
    testing::internal::AssertHelper::operator=(&local_450,&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_481 = pstore::operator==((extent<unsigned_char> *)local_3c0,
                                 (extent<unsigned_char> *)local_3d8);
  local_481 = !local_481;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_480,&local_481,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_480,
               (AssertionResult *)"extent1 == extent2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=(&local_498,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4c9 = pstore::operator==((extent<unsigned_char> *)local_3d8,
                                 (extent<unsigned_char> *)local_3c0);
  local_4c9 = !local_4c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c8,&local_4c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_4c8,
               (AssertionResult *)"extent2 == extent1","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  local_511 = pstore::operator<((extent<unsigned_char> *)local_3c0,
                                (extent<unsigned_char> *)local_3d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_510,&local_511,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_510,
               (AssertionResult *)"extent1 < extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  local_559 = pstore::operator<((extent<unsigned_char> *)local_3d8,
                                (extent<unsigned_char> *)local_3c0);
  local_559 = !local_559;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_558,&local_559,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_558,
               (AssertionResult *)"extent2 < extent1","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  local_5a1 = pstore::operator<=((extent<unsigned_char> *)local_3c0,
                                 (extent<unsigned_char> *)local_3d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5a0,&local_5a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_5a0,
               (AssertionResult *)"extent1 <= extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  local_5e9 = pstore::operator<=((extent<unsigned_char> *)local_3d8,
                                 (extent<unsigned_char> *)local_3c0);
  local_5e9 = !local_5e9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5e8,&local_5e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_5e8,
               (AssertionResult *)"!(extent2 <= extent1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  local_631 = pstore::operator>((extent<unsigned_char> *)local_3d8,
                                (extent<unsigned_char> *)local_3c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,&local_631,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_630,
               (AssertionResult *)"extent2 > extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x10c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_679 = pstore::operator>((extent<unsigned_char> *)local_3c0,
                                (extent<unsigned_char> *)local_3d8);
  local_679 = !local_679;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_678,&local_679,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_678,
               (AssertionResult *)"!(extent1 > extent2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x10d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  local_6c1 = pstore::operator>=((extent<unsigned_char> *)local_3d8,
                                 (extent<unsigned_char> *)local_3c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6c0,&local_6c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_6c0,
               (AssertionResult *)"extent2 >= extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  local_709 = pstore::operator>=((extent<unsigned_char> *)local_3c0,
                                 (extent<unsigned_char> *)local_3d8);
  local_709 = !local_709;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_708,&local_709,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&extent1_2.size,(internal *)local_708,
               (AssertionResult *)"!(extent1 >= extent2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    std::__cxx11::string::~string((string *)&extent1_2.size);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  extent2_2.size = (uint64_t)pstore::typed_address<unsigned_char>::make(2);
  _local_750 = pstore::make_extent<unsigned_char>((typed_address<unsigned_char>)extent2_2.size,4);
  gtest_ar__24.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::typed_address<unsigned_char>::make(2);
  _local_768 = pstore::make_extent<unsigned_char>
                         ((typed_address<unsigned_char>)
                          gtest_ar__24.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,5);
  local_781 = pstore::operator!=((extent<unsigned_char> *)local_750,
                                 (extent<unsigned_char> *)local_768);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_780,&local_781,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_780,
               (AssertionResult *)"extent1 != extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=(&local_798,&local_790);
    testing::internal::AssertHelper::~AssertHelper(&local_798);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  local_7c9 = pstore::operator!=((extent<unsigned_char> *)local_768,
                                 (extent<unsigned_char> *)local_750);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c8,&local_7c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_7c8,
               (AssertionResult *)"extent2 != extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  local_811 = pstore::operator==((extent<unsigned_char> *)local_750,
                                 (extent<unsigned_char> *)local_768);
  local_811 = !local_811;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_810,&local_811,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_810,
               (AssertionResult *)"extent1 == extent2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  local_859 = pstore::operator==((extent<unsigned_char> *)local_768,
                                 (extent<unsigned_char> *)local_750);
  local_859 = !local_859;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_858,
               (AssertionResult *)"extent2 == extent1","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_870,&local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  local_8a1 = pstore::operator<((extent<unsigned_char> *)local_750,
                                (extent<unsigned_char> *)local_768);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_8a0,
               (AssertionResult *)"extent1 < extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  local_8e9 = pstore::operator<((extent<unsigned_char> *)local_768,
                                (extent<unsigned_char> *)local_750);
  local_8e9 = !local_8e9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_8e8,
               (AssertionResult *)"extent2 < extent1","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  local_931 = pstore::operator<=((extent<unsigned_char> *)local_750,
                                 (extent<unsigned_char> *)local_768);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_930,&local_931,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_930,
               (AssertionResult *)"extent1 <= extent2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  local_979 = pstore::operator<=((extent<unsigned_char> *)local_768,
                                 (extent<unsigned_char> *)local_750);
  local_979 = !local_979;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_978,&local_979,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_978,
               (AssertionResult *)"!(extent2 <= extent1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_990,&local_988);
    testing::internal::AssertHelper::~AssertHelper(&local_990);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  local_9c1 = pstore::operator>((extent<unsigned_char> *)local_768,
                                (extent<unsigned_char> *)local_750);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c0,&local_9c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_9c0,
               (AssertionResult *)"extent2 > extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9d8,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  local_a09 = pstore::operator>((extent<unsigned_char> *)local_750,
                                (extent<unsigned_char> *)local_768);
  local_a09 = !local_a09;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a08,&local_a09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_a08,
               (AssertionResult *)"!(extent1 > extent2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  local_a51 = pstore::operator>=((extent<unsigned_char> *)local_768,
                                 (extent<unsigned_char> *)local_750);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a50,&local_a51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__35.message_,(internal *)local_a50,
               (AssertionResult *)"extent2 >= extent1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a68,&local_a60);
    testing::internal::AssertHelper::~AssertHelper(&local_a68);
    std::__cxx11::string::~string((string *)&gtest_ar__35.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_a99 = pstore::operator>=((extent<unsigned_char> *)local_750,
                                 (extent<unsigned_char> *)local_768);
  local_a99 = !local_a99;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a98,&local_a99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ad0,(internal *)local_a98,(AssertionResult *)"!(extent1 >= extent2)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_address.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ab0,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper(&local_ab0);
    std::__cxx11::string::~string((string *)&local_ad0);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  return;
}

Assistant:

TEST (Extent, ComparisonOperators) {
    {
        auto const extent1 =
            make_extent (pstore::typed_address<std::uint8_t>::make (2), UINT64_C (4));
        auto const extent2 =
            make_extent (pstore::typed_address<std::uint8_t>::make (2), UINT64_C (4));

        EXPECT_TRUE (extent1 == extent2);
        EXPECT_TRUE (!(extent1 != extent2));
        EXPECT_TRUE (!(extent1 < extent2));
        EXPECT_TRUE (extent1 <= extent2);
        EXPECT_TRUE (!(extent1 > extent2));
        EXPECT_TRUE (extent1 >= extent2);
        EXPECT_TRUE (extent1 == extent1);
        EXPECT_TRUE (!(extent2 != extent1));
        EXPECT_TRUE (!(extent2 < extent1));
        EXPECT_TRUE (extent2 <= extent1);
        EXPECT_TRUE (!(extent2 > extent1));
        EXPECT_TRUE (extent2 >= extent1);
    }
    {
        auto const extent1 =
            make_extent (pstore::typed_address<std::uint8_t>::make (2), UINT64_C (4));
        auto const extent2 =
            make_extent (pstore::typed_address<std::uint8_t>::make (5), UINT64_C (4)); // bigger

        EXPECT_TRUE (extent1 != extent2);
        EXPECT_TRUE (extent2 != extent1);
        EXPECT_FALSE (extent1 == extent2);
        EXPECT_FALSE (extent2 == extent1);
        EXPECT_TRUE (extent1 < extent2);
        EXPECT_FALSE (extent2 < extent1);
        EXPECT_TRUE (extent1 <= extent2);
        EXPECT_TRUE (!(extent2 <= extent1));
        EXPECT_TRUE (extent2 > extent1);
        EXPECT_TRUE (!(extent1 > extent2));
        EXPECT_TRUE (extent2 >= extent1);
        EXPECT_TRUE (!(extent1 >= extent2));
    }
    {
        auto const extent1 =
            make_extent (pstore::typed_address<std::uint8_t>::make (2), UINT64_C (4));
        auto const extent2 =
            make_extent (pstore::typed_address<std::uint8_t>::make (2), UINT64_C (5)); // bigger

        EXPECT_TRUE (extent1 != extent2);
        EXPECT_TRUE (extent2 != extent1);
        EXPECT_FALSE (extent1 == extent2);
        EXPECT_FALSE (extent2 == extent1);
        EXPECT_TRUE (extent1 < extent2);
        EXPECT_FALSE (extent2 < extent1);
        EXPECT_TRUE (extent1 <= extent2);
        EXPECT_TRUE (!(extent2 <= extent1));
        EXPECT_TRUE (extent2 > extent1);
        EXPECT_TRUE (!(extent1 > extent2));
        EXPECT_TRUE (extent2 >= extent1);
        EXPECT_TRUE (!(extent1 >= extent2));
    }
}